

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

HFSubConsumer * __thiscall
AbstractModuleClient::subscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule,
          size_t messageBufferLength)

{
  pointer pcVar1;
  bool bVar2;
  HFSubConsumer *pHVar3;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  HighFreqDataType local_c0;
  
  pcVar1 = (dataName->_M_dataplus)._M_p;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + dataName->_M_string_length);
  pcVar1 = (originModule->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + originModule->_M_string_length);
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_e0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar1 = (dataName->_M_dataplus)._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar1,pcVar1 + dataName->_M_string_length);
    pcVar1 = (originModule->_M_dataplus)._M_p;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar1,pcVar1 + originModule->_M_string_length);
    pHVar3 = (HFSubConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_120,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((pHVar3->super_HighFreqSub).sockType == ST_CONSUMER) {
      return pHVar3;
    }
  }
  bVar2 = network_pimpl::hfdt_exists((this->super_MlmWrap).state,dataName,originModule);
  if (bVar2) {
    network_pimpl::find_hfdt(&local_c0,(this->super_MlmWrap).state,dataName,originModule);
    pHVar3 = MlmWrap::createConsumerSub(&this->super_MlmWrap,&local_c0,messageBufferLength);
    HighFreqDataType::~HighFreqDataType(&local_c0);
  }
  else {
    pHVar3 = (HFSubConsumer *)0x0;
  }
  return pHVar3;
}

Assistant:

HFSubConsumer* AbstractModuleClient::subscribeHighFreqData(std::string dataName, std::string originModule, size_t messageBufferLength) {
//    std::cout << "mlmWRAP: Attempting to make a Consumer Sub to [" << dataName << "] from [" << originModule << "]\n";

    if (isHfTypeCurrentlySubbed(dataName, originModule)) { //if the module is already subbed, return the current sub object
        HighFreqSub* sub = getHfSubObject(dataName, originModule);
        if(sub->getSubSockType() == HighFreqSub::ST_CONSUMER)
            return (HFSubConsumer*)sub;
    }

    if (state->hfdt_exists(dataName, originModule)) { //check to make sure the requested type is provided by another module
        return( createConsumerSub( state->find_hfdt(dataName, originModule), messageBufferLength ) );
    }
    else {
        // std::cerr << error("The specified type does not exist.\n");
        return(NULL);
    }
}